

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O3

void rapidjson::internal::DigitGen(DiyFp *W,DiyFp *Mp,uint64_t delta,char *buffer,int *len,int *K)

{
  uint64_t uVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  char cVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  
  bVar2 = -(char)Mp->e;
  uVar9 = 1L << (bVar2 & 0x3f);
  uVar7 = Mp->f;
  uVar13 = uVar7 >> (bVar2 & 0x3f);
  uVar1 = W->f;
  uVar15 = 1;
  uVar10 = (uint)uVar13;
  if (((((9 < uVar10) && (uVar15 = 2, 99 < uVar10)) && (uVar15 = 3, 999 < uVar10)) &&
      ((uVar15 = 4, 9999 < uVar10 && (uVar15 = 5, 99999 < uVar10)))) &&
     ((uVar15 = 6, 999999 < uVar10 && (uVar15 = 7, 9999999 < uVar10)))) {
    uVar15 = (ulong)(9 - (uVar10 < 100000000));
  }
  uVar5 = uVar7 - uVar1;
  uVar6 = uVar9 - 1 & uVar7;
  *len = 0;
  do {
    uVar10 = (uint)uVar13;
    if ((int)uVar15 < 1) {
      uVar10 = 0;
      do {
        uVar7 = delta;
        cVar11 = (char)(uVar6 * 10 >> (bVar2 & 0x3f));
        iVar8 = *len;
        if (cVar11 != '\0' || iVar8 != 0) {
          *len = iVar8 + 1;
          buffer[iVar8] = cVar11 + '0';
        }
        delta = uVar7 * 10;
        uVar6 = uVar6 * 10 & uVar9 - 1;
        uVar10 = uVar10 + 1;
      } while (delta < uVar6 || delta - uVar6 == 0);
      *K = *K - uVar10;
      if ((int)(1 - uVar10) < -7) {
        uVar10 = 0;
      }
      else {
        uVar10 = DigitGen::kPow10[uVar10];
      }
      if (uVar9 <= delta - uVar6) {
        uVar5 = uVar10 * uVar5;
        uVar13 = uVar5 - uVar6;
        if (uVar5 < uVar6 || uVar13 == 0) {
          return;
        }
        iVar8 = *len;
        uVar6 = uVar6 + uVar9;
        uVar7 = uVar7 * 10 - uVar6;
        do {
          if ((uVar5 <= uVar6) && (uVar13 <= uVar6 - uVar5)) {
            return;
          }
          buffer[(long)iVar8 + -1] = buffer[(long)iVar8 + -1] + -1;
          bVar16 = uVar9 <= uVar7;
          uVar7 = uVar7 - uVar9;
          if (uVar5 <= uVar6) {
            return;
          }
          uVar13 = uVar13 - uVar9;
          uVar6 = uVar6 + uVar9;
        } while (bVar16);
        return;
      }
      return;
    }
    uVar14 = (int)uVar15 - 1;
    uVar15 = (ulong)uVar14;
    switch(uVar15) {
    case 0:
      uVar3 = 0;
      goto LAB_00124d02;
    case 1:
      uVar12 = (uint)((uVar13 & 0xffffffff) / 10);
      iVar8 = (int)((uVar13 & 0xffffffff) / 10) * 10;
      break;
    case 2:
      uVar12 = (uint)((uVar13 & 0xffffffff) / 100);
      iVar8 = (int)((uVar13 & 0xffffffff) / 100) * 100;
      break;
    case 3:
      uVar12 = (uint)((uVar13 & 0xffffffff) / 1000);
      iVar8 = (int)((uVar13 & 0xffffffff) / 1000) * 1000;
      break;
    case 4:
      uVar12 = (uint)((uVar13 & 0xffffffff) / 10000);
      iVar8 = (int)((uVar13 & 0xffffffff) / 10000) * 10000;
      break;
    case 5:
      uVar12 = (uVar10 >> 5) / 0xc35;
      iVar8 = ((uVar10 >> 5) / 0xc35) * 100000;
      break;
    case 6:
      uVar12 = (uint)((uVar13 & 0xffffffff) / 1000000);
      iVar8 = (int)((uVar13 & 0xffffffff) / 1000000) * 1000000;
      break;
    case 7:
      uVar12 = (uint)((uVar13 & 0xffffffff) / 10000000);
      iVar8 = (int)((uVar13 & 0xffffffff) / 10000000) * 10000000;
      break;
    case 8:
      uVar12 = (uint)((uVar13 & 0xffffffff) / 100000000);
      iVar8 = (int)((uVar13 & 0xffffffff) / 100000000) * 100000000;
      break;
    default:
      iVar8 = *len;
      uVar3 = uVar10;
      goto LAB_00124d1e;
    }
    uVar3 = uVar10 - iVar8;
    uVar10 = uVar12;
LAB_00124d02:
    iVar8 = *len;
    if (uVar10 == 0) {
      uVar13 = (ulong)uVar3;
LAB_00124d1e:
      cVar11 = '0';
      if (iVar8 != 0) goto LAB_00124d26;
    }
    else {
      cVar11 = (char)uVar10 + '0';
LAB_00124d26:
      *len = iVar8 + 1;
      buffer[iVar8] = cVar11;
      uVar13 = (ulong)uVar3;
    }
    uVar4 = ((uVar13 & 0xffffffff) << (bVar2 & 0x3f)) + uVar6;
    if (uVar4 <= delta) {
      *K = *K + uVar14;
      uVar9 = (ulong)DigitGen::kPow10[uVar15] << (bVar2 & 0x3f);
      if ((uVar4 < uVar5) && (uVar9 <= delta - uVar4)) {
        iVar8 = *len;
        uVar15 = uVar5 - uVar4;
        uVar4 = uVar4 + uVar9;
        uVar13 = delta - uVar4;
        do {
          if ((uVar5 <= uVar4) && (uVar15 <= (uVar1 - uVar7) + uVar4)) {
            return;
          }
          buffer[(long)iVar8 + -1] = buffer[(long)iVar8 + -1] + -1;
          bVar16 = uVar9 <= uVar13;
          uVar13 = uVar13 - uVar9;
          if (uVar5 <= uVar4) {
            return;
          }
          uVar15 = uVar15 - uVar9;
          uVar4 = uVar4 + uVar9;
        } while (bVar16);
      }
      return;
    }
  } while( true );
}

Assistant:

inline void DigitGen(const DiyFp& W, const DiyFp& Mp, uint64_t delta, char* buffer, int* len, int* K) {
    static const uint32_t kPow10[] = { 1, 10, 100, 1000, 10000, 100000, 1000000, 10000000, 100000000, 1000000000 };
    const DiyFp one(uint64_t(1) << -Mp.e, Mp.e);
    const DiyFp wp_w = Mp - W;
    uint32_t p1 = static_cast<uint32_t>(Mp.f >> -one.e);
    uint64_t p2 = Mp.f & (one.f - 1);
    int kappa = CountDecimalDigit32(p1); // kappa in [0, 9]
    *len = 0;

    while (kappa > 0) {
        uint32_t d = 0;
        switch (kappa) {
            case  9: d = p1 /  100000000; p1 %=  100000000; break;
            case  8: d = p1 /   10000000; p1 %=   10000000; break;
            case  7: d = p1 /    1000000; p1 %=    1000000; break;
            case  6: d = p1 /     100000; p1 %=     100000; break;
            case  5: d = p1 /      10000; p1 %=      10000; break;
            case  4: d = p1 /       1000; p1 %=       1000; break;
            case  3: d = p1 /        100; p1 %=        100; break;
            case  2: d = p1 /         10; p1 %=         10; break;
            case  1: d = p1;              p1 =           0; break;
            default:;
        }
        if (d || *len)
            buffer[(*len)++] = static_cast<char>('0' + static_cast<char>(d));
        kappa--;
        uint64_t tmp = (static_cast<uint64_t>(p1) << -one.e) + p2;
        if (tmp <= delta) {
            *K += kappa;
            GrisuRound(buffer, *len, delta, tmp, static_cast<uint64_t>(kPow10[kappa]) << -one.e, wp_w.f);
            return;
        }
    }

    // kappa = 0
    for (;;) {
        p2 *= 10;
        delta *= 10;
        char d = static_cast<char>(p2 >> -one.e);
        if (d || *len)
            buffer[(*len)++] = static_cast<char>('0' + d);
        p2 &= one.f - 1;
        kappa--;
        if (p2 < delta) {
            *K += kappa;
            int index = -kappa;
            GrisuRound(buffer, *len, delta, p2, one.f, wp_w.f * (index < 9 ? kPow10[index] : 0));
            return;
        }
    }
}